

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexPageRealloc(Wal *pWal,int iPage,u32 **ppPage)

{
  long lVar1;
  int iVar2;
  int iVar3;
  u32 **ppuVar4;
  u32 *puVar5;
  
  if (pWal->nWiData <= iPage) {
    lVar1 = (long)iPage + 1;
    iVar2 = (int)lVar1;
    ppuVar4 = (u32 **)sqlite3Realloc(pWal->apWiData,(long)iVar2 << 3);
    if (ppuVar4 == (u32 **)0x0) {
      iVar2 = 7;
      puVar5 = (u32 *)0x0;
      goto LAB_0012bea3;
    }
    memset(ppuVar4 + pWal->nWiData,0,(lVar1 - pWal->nWiData) * 8);
    pWal->apWiData = ppuVar4;
    pWal->nWiData = iVar2;
  }
  if (pWal->exclusiveMode == '\x02') {
    puVar5 = (u32 *)sqlite3MallocZero(0x8000);
    pWal->apWiData[iPage] = puVar5;
    iVar2 = 7;
    if (pWal->apWiData[iPage] != (u32 *)0x0) {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = (*pWal->pDbFd->pMethods->xShmMap)
                      (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,pWal->apWiData + iPage);
    if (iVar2 == 0) {
      iVar2 = 0;
      if (((0 < iPage) && (sqlite3Config.xTestCallback != (_func_int_int *)0x0)) &&
         (iVar3 = (*sqlite3Config.xTestCallback)(600), iVar2 = 0, iVar3 != 0)) {
        iVar2 = 7;
      }
    }
    else if ((char)iVar2 == '\b') {
      pWal->readOnly = pWal->readOnly | 2;
      if (iVar2 == 8) {
        iVar2 = 0;
      }
    }
  }
  puVar5 = pWal->apWiData[iPage];
LAB_0012bea3:
  *ppPage = puVar5;
  return iVar2;
}

Assistant:

static SQLITE_NOINLINE int walIndexPageRealloc(
  Wal *pWal,               /* The WAL context */
  int iPage,               /* The page we seek */
  volatile u32 **ppPage    /* Write the page pointer here */
){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    sqlite3_int64 nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3Realloc((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  assert( pWal->apWiData[iPage]==0 );
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
    pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
    if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
  }else{
    rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ,
        pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
    );
    assert( pWal->apWiData[iPage]!=0
         || rc!=SQLITE_OK
         || (pWal->writeLock==0 && iPage==0) );
    testcase( pWal->apWiData[iPage]==0 && rc==SQLITE_OK );
    if( rc==SQLITE_OK ){
      if( iPage>0 && sqlite3FaultSim(600) ) rc = SQLITE_NOMEM;
    }else if( (rc&0xff)==SQLITE_READONLY ){
      pWal->readOnly |= WAL_SHM_RDONLY;
      if( rc==SQLITE_READONLY ){
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}